

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.cpp
# Opt level: O2

void __thiscall
dg::llvmdg::legacy::NTSCD::computeInterprocDependencies(NTSCD *this,Function *function)

{
  size_t sVar1;
  bool bVar2;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *psVar3;
  _Base_ptr p_Var4;
  Block *b;
  _Rb_tree_node_base *p_Var5;
  Block *b_00;
  iterator iVar6;
  Block *pBVar7;
  Block *a;
  Block *this_00;
  Block *node;
  Block *successor;
  queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
  q;
  unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  visited;
  allocator_type local_13a;
  key_equal local_139;
  _Rb_tree_node_base *local_138;
  Block *local_130;
  undefined8 local_128;
  Function *local_120;
  undefined1 local_118 [16];
  _Base_ptr local_108;
  _Rb_tree_node_base *local_100;
  _Map_pointer local_f0;
  _Base_ptr local_e8;
  _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  local_c8;
  _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  local_98;
  _Hashtable<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_120 = function;
  Function::nodes((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                   *)&local_c8,function);
  do {
    if ((_Rb_tree_header *)local_c8._M_impl.super__Rb_tree_header._M_header._M_left ==
        &local_c8._M_impl.super__Rb_tree_header) {
      Function::callReturnNodes
                ((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                  *)&local_98,local_120);
      while ((_Rb_tree_header *)local_98._M_impl.super__Rb_tree_header._M_header._M_left !=
             &local_98._M_impl.super__Rb_tree_header) {
        local_130 = *(Block **)(local_98._M_impl.super__Rb_tree_header._M_header._M_left + 1);
        local_138 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
        std::
        queue<dg::llvmdg::legacy::Block*,std::deque<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>>
        ::
        queue<std::deque<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>,void>
                  ((queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
                    *)local_118);
        std::
        _Hashtable<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_Hashtable(&local_68,local_c8._M_impl.super__Rb_tree_header._M_node_count,
                     (hash<dg::llvmdg::legacy::Block_*> *)&local_128,&local_139,&local_13a);
        std::__detail::
        _Insert_base<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&local_68,&local_130);
        psVar3 = Block::successors(local_130);
        for (p_Var4 = (psVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var4 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
          local_128 = *(undefined8 *)(p_Var4 + 1);
          iVar6 = std::
                  _Hashtable<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(&local_68,(key_type *)&local_128);
          if (iVar6.super__Node_iterator_base<dg::llvmdg::legacy::Block_*,_false>._M_cur ==
              (__node_type *)0x0) {
            std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>::
            push_back((deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                       *)local_118,(value_type *)&local_128);
            std::__detail::
            _Insert_base<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::insert((_Insert_base<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)&local_68,(value_type *)&local_128);
          }
        }
        while (local_e8 != local_108) {
          addControlDependence(this,*(Block **)local_108,local_130);
          psVar3 = Block::successors(*(Block **)local_108);
          for (p_Var4 = (psVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var4 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
              p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
            local_128 = *(undefined8 *)(p_Var4 + 1);
            iVar6 = std::
                    _Hashtable<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(&local_68,(key_type *)&local_128);
            if (iVar6.super__Node_iterator_base<dg::llvmdg::legacy::Block_*,_false>._M_cur ==
                (__node_type *)0x0) {
              std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
              ::push_back((deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                           *)local_118,(value_type *)&local_128);
              std::__detail::
              _Insert_base<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::insert((_Insert_base<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)&local_68,(value_type *)&local_128);
            }
          }
          std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>::
          pop_front((deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                     *)local_118);
        }
        std::
        _Hashtable<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_68);
        std::_Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
        ::~_Deque_base((_Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                        *)local_118);
        local_98._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)std::_Rb_tree_increment(local_138);
      }
      std::
      _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
      ::~_Rb_tree(&local_98);
      std::
      _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
      ::~_Rb_tree(&local_c8);
      return;
    }
    this_00 = *(Block **)(local_c8._M_impl.super__Rb_tree_header._M_header._M_left + 1);
    local_138 = local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
    Block::callees((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                    *)local_118,this_00);
    if (local_f0 == (_Map_pointer)0x0) {
      Block::joins((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                    *)&local_68,this_00);
      sVar1 = local_68._M_rehash_policy._M_next_resize;
      std::
      _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
      ::~_Rb_tree((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                   *)&local_68);
      std::
      _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
      ::~_Rb_tree((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                   *)local_118);
      if (sVar1 != 0) goto LAB_0015151e;
    }
    else {
      std::
      _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
      ::~_Rb_tree((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                   *)local_118);
LAB_0015151e:
      psVar3 = Block::successors(this_00);
      p_Var4 = (psVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      psVar3 = Block::successors(this_00);
      for (; (_Rb_tree_header *)p_Var4 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        bVar2 = Block::isCallReturn(*(Block **)(p_Var4 + 1));
        if (bVar2) break;
      }
      psVar3 = Block::successors(this_00);
      if ((_Rb_tree_header *)p_Var4 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header) {
        pBVar7 = this_00;
        Block::callees((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                        *)local_118,this_00);
        p_Var5 = local_100;
        while (p_Var5 != (_Rb_tree_node_base *)(local_118 + 8)) {
          a = *(Block **)(p_Var4 + 1);
          Function::exit((Function *)p_Var5[1]._M_parent,(int)pBVar7);
          addControlDependence(this,a,b);
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
          pBVar7 = a;
        }
        std::
        _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
        ::~_Rb_tree((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                     *)local_118);
        Block::joins((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                      *)local_118,this_00);
        p_Var5 = local_100;
        while (p_Var5 != (_Rb_tree_node_base *)(local_118 + 8)) {
          pBVar7 = *(Block **)(p_Var4 + 1);
          Function::exit((Function *)p_Var5[1]._M_parent,(int)this_00);
          addControlDependence(this,pBVar7,b_00);
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
          this_00 = pBVar7;
        }
        std::
        _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
        ::~_Rb_tree((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                     *)local_118);
      }
    }
    local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)std::_Rb_tree_increment(local_138);
  } while( true );
}

Assistant:

void NTSCD::computeInterprocDependencies(Function *function) {
    DBG_SECTION_BEGIN(cda, "Computing interprocedural CD");

    const auto &nodes = function->nodes();
    for (auto *node : nodes) {
        if (!node->callees().empty() || !node->joins().empty()) {
            auto iterator = std::find_if(
                    node->successors().begin(), node->successors().end(),
                    [](const Block *block) { return block->isCallReturn(); });
            if (iterator != node->successors().end()) {
                for (auto callee : node->callees()) {
                    addControlDependence(*iterator, callee.second->exit());
                }
                for (auto join : node->joins()) {
                    addControlDependence(*iterator, join.second->exit());
                }
            }
        }
    }

    for (auto *node : function->callReturnNodes()) {
        std::queue<Block *> q;
        std::unordered_set<Block *> visited(nodes.size());
        visited.insert(node);
        for (auto *successor : node->successors()) {
            if (visited.find(successor) == visited.end()) {
                q.push(successor);
                visited.insert(successor);
            }
        }
        while (!q.empty()) {
            addControlDependence(q.front(), node);
            for (auto *successor : q.front()->successors()) {
                if (visited.find(successor) == visited.end()) {
                    q.push(successor);
                    visited.insert(successor);
                }
            }
            q.pop();
        }
    }
    DBG_SECTION_END(cda, "Finished computing interprocedural CD");
}